

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineCommand.cpp
# Opt level: O1

void anon_unknown.dwarf_19404::ackermannUsage(string *cmd)

{
  FILE *__stream;
  char *pcVar1;
  
  __stream = _stderr;
  pcVar1 = llbuild::commands::getProgramName();
  fprintf(__stream,"Usage: %s buildengine %s [options] <M> <N>\n",pcVar1,(cmd->_M_dataplus)._M_p);
  fwrite("\nOptions:\n",10,1,_stderr);
  fprintf(_stderr,"  %-*s %s\n",0x14,"--help","show this help message and exit");
  fprintf(_stderr,"  %-*s %s\n",0x14,"--dump-graph <PATH>",
          "dump build graph to PATH in Graphviz DOT format");
  fprintf(_stderr,"  %-*s %s\n",0x14,"--recompute <N>",
          "recompute the result N times, to stress dependency checking");
  fprintf(_stderr,"  %-*s %s\n",0x14,"--trace <PATH>","trace build engine operation to PATH");
  exit(1);
}

Assistant:

static void ackermannUsage(std::string cmd) {
  int optionWidth = 20;
  fprintf(stderr, "Usage: %s buildengine %s [options] <M> <N>\n",
          getProgramName(), cmd.c_str());
  fprintf(stderr, "\nOptions:\n");
  fprintf(stderr, "  %-*s %s\n", optionWidth, "--help",
          "show this help message and exit");
  fprintf(stderr, "  %-*s %s\n", optionWidth, "--dump-graph <PATH>",
          "dump build graph to PATH in Graphviz DOT format");
  fprintf(stderr, "  %-*s %s\n", optionWidth, "--recompute <N>",
          "recompute the result N times, to stress dependency checking");
  fprintf(stderr, "  %-*s %s\n", optionWidth, "--trace <PATH>",
          "trace build engine operation to PATH");
  ::exit(1);
}